

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlTextReaderGetErrorHandler(void)

{
  int iVar1;
  int iVar2;
  xmlTextReaderPtr val;
  void **val_00;
  int local_3c;
  int n_arg;
  void **arg;
  int n_f;
  xmlTextReaderErrorFunc *f;
  int n_reader;
  xmlTextReaderPtr reader;
  int mem_base;
  int test_ret;
  
  reader._4_4_ = 0;
  for (f._4_4_ = 0; (int)f._4_4_ < 4; f._4_4_ = f._4_4_ + 1) {
    for (arg._4_4_ = 0; (int)arg._4_4_ < 1; arg._4_4_ = arg._4_4_ + 1) {
      for (local_3c = 0; local_3c < 1; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlTextReaderPtr(f._4_4_,0);
        val_00 = gen_void_ptr_ptr(local_3c,2);
        xmlTextReaderGetErrorHandler(val,0,val_00);
        call_tests = call_tests + 1;
        des_xmlTextReaderPtr(f._4_4_,val,0);
        des_void_ptr_ptr(local_3c,val_00,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderGetErrorHandler",
                 (ulong)(uint)(iVar2 - iVar1));
          reader._4_4_ = reader._4_4_ + 1;
          printf(" %d",(ulong)f._4_4_);
          printf(" %d",(ulong)arg._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return reader._4_4_;
}

Assistant:

static int
test_xmlTextReaderGetErrorHandler(void) {
    int test_ret = 0;

#if defined(LIBXML_READER_ENABLED)
    int mem_base;
    xmlTextReaderPtr reader; /* the xmlTextReaderPtr used */
    int n_reader;
    xmlTextReaderErrorFunc * f; /* the callback function or NULL is no callback has been registered */
    int n_f;
    void ** arg; /* a user argument */
    int n_arg;

    for (n_reader = 0;n_reader < gen_nb_xmlTextReaderPtr;n_reader++) {
    for (n_f = 0;n_f < gen_nb_xmlTextReaderErrorFunc_ptr;n_f++) {
    for (n_arg = 0;n_arg < gen_nb_void_ptr_ptr;n_arg++) {
        mem_base = xmlMemBlocks();
        reader = gen_xmlTextReaderPtr(n_reader, 0);
        f = gen_xmlTextReaderErrorFunc_ptr(n_f, 1);
        arg = gen_void_ptr_ptr(n_arg, 2);

        xmlTextReaderGetErrorHandler(reader, f, arg);
        call_tests++;
        des_xmlTextReaderPtr(n_reader, reader, 0);
        des_xmlTextReaderErrorFunc_ptr(n_f, f, 1);
        des_void_ptr_ptr(n_arg, arg, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlTextReaderGetErrorHandler",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_reader);
            printf(" %d", n_f);
            printf(" %d", n_arg);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}